

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

uint8_t __thiscall ymfm::ymf288::read_status_hi(ymf288 *this)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  
  bVar3 = ~this->m_flag_control & (this->m_fm).m_status & 3;
  (this->m_fm).m_status = bVar3;
  (*(code *)((this->m_fm).m_intf)->m_engine[1]._vptr_ymfm_engine_callbacks)();
  cVar1 = (*(code *)((this->m_fm).m_intf)->m_engine[4]._vptr_ymfm_engine_callbacks)();
  bVar2 = bVar3 | 0x80;
  if (cVar1 == '\0') {
    bVar2 = bVar3;
  }
  return bVar2;
}

Assistant:

uint8_t ymf288::read_status_hi()
{
	// fetch regular status
	uint8_t status = m_fm.status() & (fm_engine::STATUS_TIMERA | fm_engine::STATUS_TIMERB);

	// turn off any bits that have been requested to be masked
	status &= ~(m_flag_control & 0x03);

	// update the status so that IRQs are propagated
	m_fm.set_reset_status(status, ~status);

	// merge in the busy flag
	if (m_fm.intf().ymfm_is_busy())
		status |= fm_engine::STATUS_BUSY;
	return status;
}